

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderErrors.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderErrorsTestCaseBase::deinit(TessellationShaderErrorsTestCaseBase *this)

{
  GLuint *pGVar1;
  int iVar2;
  undefined4 extraout_var;
  uint n_program_object;
  ulong uVar4;
  long lVar3;
  
  TestCaseBase::deinit(&this->super_TestCaseBase);
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == true) {
    iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar3 = CONCAT44(extraout_var,iVar2);
    for (uVar4 = 0; pGVar1 = this->m_fs_ids, uVar4 < this->m_n_program_objects; uVar4 = uVar4 + 1) {
      if ((pGVar1 != (GLuint *)0x0) && (pGVar1[uVar4] != 0)) {
        (**(code **)(lVar3 + 0x470))();
        this->m_fs_ids[uVar4] = 0;
      }
      if ((this->m_po_ids != (GLuint *)0x0) && (this->m_po_ids[uVar4] != 0)) {
        (**(code **)(lVar3 + 0x448))();
        this->m_po_ids[uVar4] = 0;
      }
      if ((this->m_tc_ids != (GLuint *)0x0) && (this->m_tc_ids[uVar4] != 0)) {
        (**(code **)(lVar3 + 0x470))();
        this->m_tc_ids[uVar4] = 0;
      }
      if ((this->m_te_ids != (GLuint *)0x0) && (this->m_te_ids[uVar4] != 0)) {
        (**(code **)(lVar3 + 0x470))();
        this->m_te_ids[uVar4] = 0;
      }
      if ((this->m_vs_ids != (GLuint *)0x0) && (this->m_vs_ids[uVar4] != 0)) {
        (**(code **)(lVar3 + 0x470))();
        this->m_vs_ids[uVar4] = 0;
      }
    }
    if (pGVar1 != (GLuint *)0x0) {
      operator_delete__(pGVar1);
      this->m_fs_ids = (GLuint *)0x0;
    }
    if (this->m_po_ids != (GLuint *)0x0) {
      operator_delete__(this->m_po_ids);
      this->m_po_ids = (GLuint *)0x0;
    }
    if (this->m_tc_ids != (GLuint *)0x0) {
      operator_delete__(this->m_tc_ids);
      this->m_tc_ids = (GLuint *)0x0;
    }
    if (this->m_te_ids != (GLuint *)0x0) {
      operator_delete__(this->m_te_ids);
      this->m_te_ids = (GLuint *)0x0;
    }
    if (this->m_vs_ids != (GLuint *)0x0) {
      operator_delete__(this->m_vs_ids);
      this->m_vs_ids = (GLuint *)0x0;
    }
  }
  return;
}

Assistant:

void TessellationShaderErrorsTestCaseBase::deinit()
{
	/* Call base class' deinit() */
	TestCaseBase::deinit();

	if (!m_is_tessellation_shader_supported)
	{
		return;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Release all shader objects created for the test */
	for (unsigned int n_program_object = 0; n_program_object < m_n_program_objects; ++n_program_object)
	{
		if (m_fs_ids != DE_NULL && m_fs_ids[n_program_object] != 0)
		{
			gl.deleteShader(m_fs_ids[n_program_object]);

			m_fs_ids[n_program_object] = 0;
		}

		if (m_po_ids != DE_NULL && m_po_ids[n_program_object] != 0)
		{
			gl.deleteProgram(m_po_ids[n_program_object]);

			m_po_ids[n_program_object] = 0;
		}

		if (m_tc_ids != DE_NULL && m_tc_ids[n_program_object] != 0)
		{
			gl.deleteShader(m_tc_ids[n_program_object]);

			m_tc_ids[n_program_object] = 0;
		}

		if (m_te_ids != DE_NULL && m_te_ids[n_program_object] != 0)
		{
			gl.deleteShader(m_te_ids[n_program_object]);

			m_te_ids[n_program_object] = 0;
		}

		if (m_vs_ids != DE_NULL && m_vs_ids[n_program_object] != 0)
		{
			gl.deleteShader(m_vs_ids[n_program_object]);

			m_vs_ids[n_program_object] = 0;
		}
	} /* for (all shader objects) */

	/* Release buffers allocated for the test */
	if (m_fs_ids != DE_NULL)
	{
		delete[] m_fs_ids;

		m_fs_ids = DE_NULL;
	}

	if (m_po_ids != DE_NULL)
	{
		delete[] m_po_ids;

		m_po_ids = DE_NULL;
	}

	if (m_tc_ids != DE_NULL)
	{
		delete[] m_tc_ids;

		m_tc_ids = DE_NULL;
	}

	if (m_te_ids != DE_NULL)
	{
		delete[] m_te_ids;

		m_te_ids = DE_NULL;
	}

	if (m_vs_ids != DE_NULL)
	{
		delete[] m_vs_ids;

		m_vs_ids = DE_NULL;
	}
}